

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O0

uint32_t create_pixel(Display *dpy,uint8_t red,uint8_t green,uint8_t blue)

{
  int iVar1;
  char *__nptr;
  char *str;
  XColor xcolour;
  Colormap cmap;
  uint8_t blue_local;
  uint8_t green_local;
  uint8_t red_local;
  Display *dpy_local;
  
  xcolour._8_8_ = *(undefined8 *)(*(long *)(dpy + 0xe8) + (long)*(int *)(dpy + 0xe0) * 0x80 + 0x50);
  if (!gamma_table_ready) {
    __nptr = getenv("ANGBAND_X11_GAMMA");
    if (__nptr != (char *)0x0) {
      gamma_val = atoi(__nptr);
    }
    gamma_table_ready = true;
    if (gamma_val != L'\0') {
      build_gamma_table(gamma_val);
    }
  }
  cmap._5_1_ = blue;
  cmap._6_1_ = green;
  cmap._7_1_ = red;
  if (L'\0' < gamma_val) {
    cmap._7_1_ = gamma_table[red];
    cmap._6_1_ = gamma_table[green];
    cmap._5_1_ = gamma_table[blue];
  }
  xcolour.pixel._0_2_ = (ushort)cmap._7_1_ * 0x101;
  xcolour.pixel._2_2_ = (ushort)cmap._6_1_ * 0x101;
  xcolour.pixel._4_2_ = (ushort)cmap._5_1_ * 0x101;
  xcolour.pixel._6_1_ = 7;
  iVar1 = XAllocColor(dpy,xcolour._8_8_,&str);
  if (iVar1 == 0) {
    quit_fmt("Couldn\'t allocate bitmap color #%04x%04x%04x\n",(ulong)(ushort)xcolour.pixel,
             (ulong)xcolour.pixel._2_2_,(ulong)xcolour.pixel._4_2_);
  }
  return (uint32_t)str;
}

Assistant:

static uint32_t create_pixel(Display *dpy, uint8_t red, uint8_t green,
		uint8_t blue)
{
	Colormap cmap = DefaultColormapOfScreen(DefaultScreenOfDisplay(dpy));

	XColor xcolour;

	if (!gamma_table_ready) {
		const char *str = getenv("ANGBAND_X11_GAMMA");
		if (str != NULL) gamma_val = atoi(str);

		gamma_table_ready = true;

		/* Only need to build the table if gamma exists */
		if (gamma_val) build_gamma_table(gamma_val);
	}

	/* Hack -- Gamma Correction */
	if (gamma_val > 0) {
		red = gamma_table[red];
		green = gamma_table[green];
		blue = gamma_table[blue];
	}

	/* Build the color */

	xcolour.red   = red * 257;
	xcolour.green = green * 257;
	xcolour.blue  = blue * 257;
	xcolour.flags = DoRed | DoGreen | DoBlue;

	/* Attempt to Allocate the Parsed color */
	if (!(XAllocColor(dpy, cmap, &xcolour))) {
		quit_fmt("Couldn't allocate bitmap color #%04x%04x%04x\n",
			 xcolour.red, xcolour.green, xcolour.blue);
	}

	return (xcolour.pixel);
}